

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall kj::str<signed_char&>(String *__return_storage_ptr__,kj *this,char *params)

{
  CappedArray<char,_5UL> CVar1;
  size_t local_18;
  undefined4 local_10;
  char local_c;
  
  CVar1 = toCharSequence<signed_char&>((char *)this);
  local_18 = CVar1.currentSize;
  local_10 = CVar1.content._0_4_;
  local_c = CVar1.content[4];
  _::concat<kj::CappedArray<char,5ul>>
            (__return_storage_ptr__,(_ *)&local_18,(CappedArray<char,_5UL> *)(CVar1._8_8_ >> 0x20));
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}